

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_auth_client.c
# Opt level: O3

IOTHUB_SECURITY_HANDLE iothub_device_auth_create(void)

{
  HSM_CLIENT_DESTROY p_Var1;
  HSM_CLIENT_SIGN_WITH_IDENTITY p_Var2;
  HSM_CLIENT_GET_CERTIFICATE p_Var3;
  HSM_CLIENT_GET_ALIAS_KEY p_Var4;
  HSM_CLIENT_GET_SYMMETRICAL_KEY p_Var5;
  HSM_CLIENT_SET_SYMMETRICAL_KEY_INFO p_Var6;
  IOTHUB_SECURITY_TYPE IVar7;
  int iVar8;
  IOTHUB_SECURITY_HANDLE __ptr;
  HSM_CLIENT_TPM_INTERFACE *pHVar9;
  LOGGER_LOG p_Var10;
  HSM_CLIENT_X509_INTERFACE *pHVar11;
  HSM_CLIENT_HANDLE pvVar12;
  HSM_CLIENT_KEY_INTERFACE *pHVar13;
  char *pcVar14;
  HSM_CLIENT_CREATE p_Var15;
  char *pcVar16;
  
  IVar7 = iothub_security_type();
  __ptr = (IOTHUB_SECURITY_HANDLE)calloc(1,0x70);
  if (__ptr == (IOTHUB_SECURITY_HANDLE)0x0) {
    p_Var10 = xlogging_get_log_function();
    if (p_Var10 == (LOGGER_LOG)0x0) {
      return (IOTHUB_SECURITY_HANDLE)0x0;
    }
    pcVar16 = "Failed allocating IOTHUB_SECURITY_INFO.";
    iVar8 = 0x82;
    goto LAB_0014441d;
  }
  if (IVar7 == IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY) {
    __ptr->cred_type = AUTH_TYPE_SYMM_KEY;
    __ptr->base64_encode_signature = true;
    __ptr->urlencode_token_scope = false;
    pHVar13 = hsm_client_key_interface();
    if (pHVar13 != (HSM_CLIENT_KEY_INTERFACE *)0x0) {
      p_Var15 = pHVar13->hsm_client_key_create;
      __ptr->hsm_client_create = p_Var15;
      if (p_Var15 != (HSM_CLIENT_CREATE)0x0) {
        p_Var1 = pHVar13->hsm_client_key_destroy;
        __ptr->hsm_client_destroy = p_Var1;
        if ((p_Var1 != (HSM_CLIENT_DESTROY)0x0) &&
           (p_Var5 = pHVar13->hsm_client_get_symm_key, __ptr->hsm_client_get_symm_key = p_Var5,
           p_Var5 != (HSM_CLIENT_GET_SYMMETRICAL_KEY)0x0)) {
          p_Var6 = pHVar13->hsm_client_set_symm_key_info;
          __ptr->hsm_client_set_symm_key_info = p_Var6;
          if (p_Var6 != (HSM_CLIENT_SET_SYMMETRICAL_KEY_INFO)0x0) {
            pvVar12 = (*p_Var15)();
            __ptr->hsm_client_handle = pvVar12;
            if (pvVar12 != (HSM_CLIENT_HANDLE)0x0) {
              pcVar16 = iothub_security_get_symm_registration_name();
              pcVar14 = iothub_security_get_symmetric_key();
              iVar8 = (*p_Var6)(pvVar12,pcVar16,pcVar14);
              if (iVar8 == 0) {
                return __ptr;
              }
              p_Var10 = xlogging_get_log_function();
              if (p_Var10 != (LOGGER_LOG)0x0) {
                (*p_Var10)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                           ,"iothub_device_auth_create",0xea,1,
                           "Invalid x509 secure device interface was specified");
              }
              (*p_Var1)(pvVar12);
              goto LAB_0014437b;
            }
            goto LAB_0014443e;
          }
        }
      }
    }
    p_Var10 = xlogging_get_log_function();
    if (p_Var10 != (LOGGER_LOG)0x0) {
      pcVar16 = "Invalid x509 secure device interface was specified";
      iVar8 = 0xbc;
LAB_001443dc:
      (*p_Var10)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                 ,"iothub_device_auth_create",iVar8,1,pcVar16);
    }
  }
  else if (IVar7 == IOTHUB_SECURITY_TYPE_X509) {
    __ptr->cred_type = AUTH_TYPE_X509;
    __ptr->base64_encode_signature = true;
    __ptr->urlencode_token_scope = false;
    pHVar11 = hsm_client_x509_interface();
    if (pHVar11 != (HSM_CLIENT_X509_INTERFACE *)0x0) {
      p_Var15 = pHVar11->hsm_client_x509_create;
      __ptr->hsm_client_create = p_Var15;
      if ((((p_Var15 != (HSM_CLIENT_CREATE)0x0) &&
           (p_Var1 = pHVar11->hsm_client_x509_destroy, __ptr->hsm_client_destroy = p_Var1,
           p_Var1 != (HSM_CLIENT_DESTROY)0x0)) &&
          (p_Var3 = pHVar11->hsm_client_get_cert, __ptr->hsm_client_get_cert = p_Var3,
          p_Var3 != (HSM_CLIENT_GET_CERTIFICATE)0x0)) &&
         (p_Var4 = pHVar11->hsm_client_get_key, __ptr->hsm_client_get_alias_key = p_Var4,
         p_Var4 != (HSM_CLIENT_GET_ALIAS_KEY)0x0)) {
LAB_00144267:
        pvVar12 = (*p_Var15)();
        __ptr->hsm_client_handle = pvVar12;
        if (pvVar12 != (HSM_CLIENT_HANDLE)0x0) {
          return __ptr;
        }
LAB_0014443e:
        p_Var10 = xlogging_get_log_function();
        if (p_Var10 == (LOGGER_LOG)0x0) goto LAB_0014437b;
        pcVar16 = "failed create device auth module.";
        iVar8 = 0xe4;
        goto LAB_00144370;
      }
    }
    p_Var10 = xlogging_get_log_function();
    if (p_Var10 != (LOGGER_LOG)0x0) {
      pcVar16 = "Invalid handle parameter: DEVICE_AUTH_CREATION_INFO is NULL";
      iVar8 = 0xa8;
      goto LAB_001443dc;
    }
  }
  else {
    if (IVar7 != IOTHUB_SECURITY_TYPE_SAS) {
      p_Var10 = xlogging_get_log_function();
      if (p_Var10 == (LOGGER_LOG)0x0) goto LAB_0014437b;
      pcVar16 = "hsm_client_create is not a valid address";
      iVar8 = 0xdc;
LAB_00144370:
      (*p_Var10)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                 ,"iothub_device_auth_create",iVar8,1,pcVar16);
LAB_0014437b:
      free(__ptr);
      return (IOTHUB_SECURITY_HANDLE)0x0;
    }
    __ptr->cred_type = AUTH_TYPE_SAS;
    __ptr->base64_encode_signature = true;
    __ptr->urlencode_token_scope = false;
    pHVar9 = hsm_client_tpm_interface();
    if (pHVar9 != (HSM_CLIENT_TPM_INTERFACE *)0x0) {
      p_Var15 = pHVar9->hsm_client_tpm_create;
      __ptr->hsm_client_create = p_Var15;
      if (((p_Var15 != (HSM_CLIENT_CREATE)0x0) &&
          (p_Var1 = pHVar9->hsm_client_tpm_destroy, __ptr->hsm_client_destroy = p_Var1,
          p_Var1 != (HSM_CLIENT_DESTROY)0x0)) &&
         (p_Var2 = pHVar9->hsm_client_sign_with_identity, __ptr->hsm_client_sign_data = p_Var2,
         p_Var2 != (HSM_CLIENT_SIGN_WITH_IDENTITY)0x0)) goto LAB_00144267;
    }
    p_Var10 = xlogging_get_log_function();
    if (p_Var10 != (LOGGER_LOG)0x0) {
      pcVar16 = "Invalid secure device interface";
      iVar8 = 0x94;
      goto LAB_001443dc;
    }
  }
  free(__ptr);
  p_Var10 = xlogging_get_log_function();
  if (p_Var10 == (LOGGER_LOG)0x0) {
    return (IOTHUB_SECURITY_HANDLE)0x0;
  }
  pcVar16 = "Error allocating result or else unsupported security type %d";
  iVar8 = 0xd8;
LAB_0014441d:
  (*p_Var10)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
             ,"iothub_device_auth_create",iVar8,1,pcVar16);
  return (IOTHUB_SECURITY_HANDLE)0x0;
}

Assistant:

IOTHUB_SECURITY_HANDLE iothub_device_auth_create()
{
    IOTHUB_SECURITY_INFO* result;

    IOTHUB_SECURITY_TYPE iothub_security_t = iothub_security_type();

    if ((result = (IOTHUB_SECURITY_INFO*)malloc(sizeof(IOTHUB_SECURITY_INFO))) == NULL)
    {
        LogError("Failed allocating IOTHUB_SECURITY_INFO.");
    }
    else
    {
        memset(result, 0, sizeof(IOTHUB_SECURITY_INFO) );
#if defined(HSM_TYPE_SAS_TOKEN)  || defined(HSM_AUTH_TYPE_CUSTOM)
        if (iothub_security_t == IOTHUB_SECURITY_TYPE_SAS)
        {
            result->cred_type = AUTH_TYPE_SAS;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_TPM_INTERFACE* tpm_interface = hsm_client_tpm_interface();
            if ((tpm_interface == NULL) ||
                ((result->hsm_client_create = tpm_interface->hsm_client_tpm_create) == NULL) ||
                ((result->hsm_client_destroy = tpm_interface->hsm_client_tpm_destroy) == NULL) ||
                ((result->hsm_client_sign_data = tpm_interface->hsm_client_sign_with_identity) == NULL)
                )
            {
                LogError("Invalid secure device interface");
                free(result);
                result = NULL;
            }
        }
#endif
#if defined(HSM_TYPE_X509) || defined(HSM_TYPE_RIOT) || defined(HSM_AUTH_TYPE_CUSTOM)
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_X509)
        {
            result->cred_type = AUTH_TYPE_X509;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_X509_INTERFACE* x509_interface = hsm_client_x509_interface();
            if ((x509_interface == NULL) ||
                ((result->hsm_client_create = x509_interface->hsm_client_x509_create) == NULL) ||
                ((result->hsm_client_destroy = x509_interface->hsm_client_x509_destroy) == NULL) ||
                ((result->hsm_client_get_cert = x509_interface->hsm_client_get_cert) == NULL) ||
                ((result->hsm_client_get_alias_key = x509_interface->hsm_client_get_key) == NULL)
                )
            {
                LogError("Invalid handle parameter: DEVICE_AUTH_CREATION_INFO is NULL");
                free(result);
                result = NULL;
            }
        }
#endif
#if defined(HSM_TYPE_SYMM_KEY) || defined(HSM_AUTH_TYPE_CUSTOM)
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY)
        {
            result->cred_type = AUTH_TYPE_SYMM_KEY;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_KEY_INTERFACE* key_interface = hsm_client_key_interface();
            if ((key_interface == NULL) ||
                ((result->hsm_client_create = key_interface->hsm_client_key_create) == NULL) ||
                ((result->hsm_client_destroy = key_interface->hsm_client_key_destroy) == NULL) ||
                ((result->hsm_client_get_symm_key = key_interface->hsm_client_get_symm_key) == NULL) ||
                ((result->hsm_client_set_symm_key_info = key_interface->hsm_client_set_symm_key_info) == NULL)
                )
            {
                LogError("Invalid x509 secure device interface was specified");
                free(result);
                result = NULL;
            }
        }
#endif
#ifdef HSM_TYPE_HTTP_EDGE
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_HTTP_EDGE)
        {
            result->cred_type = AUTH_TYPE_SAS;
            // Because HTTP_edge operates over HTTP, the server has already base64 encoded signature its returning to us.
            result->base64_encode_signature = false;
            result->urlencode_token_scope = true;
            const HSM_CLIENT_HTTP_EDGE_INTERFACE* http_edge_interface = hsm_client_http_edge_interface();
            if ((http_edge_interface == NULL) ||
                ((result->hsm_client_create = http_edge_interface->hsm_client_http_edge_create) == NULL) ||
                ((result->hsm_client_destroy = http_edge_interface->hsm_client_http_edge_destroy) == NULL) ||
                ((result->hsm_client_sign_data = http_edge_interface->hsm_client_sign_with_identity) == NULL) ||
                ((result->hsm_client_get_trust_bundle = http_edge_interface->hsm_client_get_trust_bundle) == NULL))
            {
                LogError("Invalid secure device interface");
                free(result);
                result = NULL;
            }
        }
#endif
        if (result == NULL)
        {
            LogError("Error allocating result or else unsupported security type %d", iothub_security_t);
        }
        else if (result->hsm_client_create == NULL)
        {
            LogError("hsm_client_create is not a valid address");
            free(result);
            result = NULL;
        }
        else
        {
            if ((result->hsm_client_handle = result->hsm_client_create()) == NULL)
            {
                LogError("failed create device auth module.");
                free(result);
                result = NULL;
            }
            else if (result->cred_type == AUTH_TYPE_SYMM_KEY && result->hsm_client_set_symm_key_info(result->hsm_client_handle, iothub_security_get_symm_registration_name(), iothub_security_get_symmetric_key()) != 0)
            {
                LogError("Invalid x509 secure device interface was specified");
                result->hsm_client_destroy(result->hsm_client_handle);
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}